

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt)

{
  int iVar1;
  char **ppcVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    if ((ctxt->encoding == (xmlChar *)0x0) && (ctxt->escape == (xmlCharEncodingOutputFunc)0x0)) {
      ctxt->escape = xmlEscapeEntities;
    }
    ppcVar2 = __xmlTreeIndentString();
    iVar1 = xmlStrlen((xmlChar *)*ppcVar2);
    ppcVar2 = __xmlTreeIndentString();
    if (iVar1 == 0 || *ppcVar2 == (char *)0x0) {
      ctxt->indent[0x2d] = '\0';
      ctxt->indent[0x2e] = '\0';
      ctxt->indent[0x2f] = '\0';
      ctxt->indent[0x30] = '\0';
      ctxt->indent[0x31] = '\0';
      ctxt->indent[0x32] = '\0';
      ctxt->indent[0x33] = '\0';
      ctxt->indent[0x34] = '\0';
      ctxt->indent[0x35] = '\0';
      ctxt->indent[0x36] = '\0';
      ctxt->indent[0x37] = '\0';
      ctxt->indent[0x38] = '\0';
      ctxt->indent[0x39] = '\0';
      ctxt->indent[0x3a] = '\0';
      ctxt->indent[0x3b] = '\0';
      ctxt->indent[0x3c] = '\0';
      ctxt->indent[0x20] = '\0';
      ctxt->indent[0x21] = '\0';
      ctxt->indent[0x22] = '\0';
      ctxt->indent[0x23] = '\0';
      ctxt->indent[0x24] = '\0';
      ctxt->indent[0x25] = '\0';
      ctxt->indent[0x26] = '\0';
      ctxt->indent[0x27] = '\0';
      ctxt->indent[0x28] = '\0';
      ctxt->indent[0x29] = '\0';
      ctxt->indent[0x2a] = '\0';
      ctxt->indent[0x2b] = '\0';
      ctxt->indent[0x2c] = '\0';
      ctxt->indent[0x2d] = '\0';
      ctxt->indent[0x2e] = '\0';
      ctxt->indent[0x2f] = '\0';
      ctxt->indent[0x10] = '\0';
      ctxt->indent[0x11] = '\0';
      ctxt->indent[0x12] = '\0';
      ctxt->indent[0x13] = '\0';
      ctxt->indent[0x14] = '\0';
      ctxt->indent[0x15] = '\0';
      ctxt->indent[0x16] = '\0';
      ctxt->indent[0x17] = '\0';
      ctxt->indent[0x18] = '\0';
      ctxt->indent[0x19] = '\0';
      ctxt->indent[0x1a] = '\0';
      ctxt->indent[0x1b] = '\0';
      ctxt->indent[0x1c] = '\0';
      ctxt->indent[0x1d] = '\0';
      ctxt->indent[0x1e] = '\0';
      ctxt->indent[0x1f] = '\0';
      ctxt->indent[0] = '\0';
      ctxt->indent[1] = '\0';
      ctxt->indent[2] = '\0';
      ctxt->indent[3] = '\0';
      ctxt->indent[4] = '\0';
      ctxt->indent[5] = '\0';
      ctxt->indent[6] = '\0';
      ctxt->indent[7] = '\0';
      ctxt->indent[8] = '\0';
      ctxt->indent[9] = '\0';
      ctxt->indent[10] = '\0';
      ctxt->indent[0xb] = '\0';
      ctxt->indent[0xc] = '\0';
      ctxt->indent[0xd] = '\0';
      ctxt->indent[0xe] = '\0';
      ctxt->indent[0xf] = '\0';
    }
    else {
      ctxt->indent_size = iVar1;
      iVar5 = 0;
      uVar3 = 0x3c / (long)iVar1 & 0xffffffff;
      ctxt->indent_nr = (int)(0x3c / (long)iVar1);
      while( true ) {
        iVar1 = ctxt->indent_size;
        if ((int)uVar3 <= iVar5) break;
        ppcVar2 = __xmlTreeIndentString();
        memcpy(ctxt->indent + iVar1 * iVar5,*ppcVar2,(long)ctxt->indent_size);
        iVar5 = iVar5 + 1;
        uVar3 = (ulong)(uint)ctxt->indent_nr;
      }
      ctxt->indent[iVar1 * (int)uVar3] = '\0';
    }
    piVar4 = __xmlSaveNoEmptyTags();
    if (*piVar4 != 0) {
      *(byte *)&ctxt->options = (byte)ctxt->options | 4;
    }
  }
  return;
}

Assistant:

static void
xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt)
{
    int i;
    int len;

    if (ctxt == NULL) return;
    if ((ctxt->encoding == NULL) && (ctxt->escape == NULL))
        ctxt->escape = xmlEscapeEntities;
    len = xmlStrlen((xmlChar *)xmlTreeIndentString);
    if ((xmlTreeIndentString == NULL) || (len == 0)) {
        memset(&ctxt->indent[0], 0, MAX_INDENT + 1);
    } else {
	ctxt->indent_size = len;
	ctxt->indent_nr = MAX_INDENT / ctxt->indent_size;
	for (i = 0;i < ctxt->indent_nr;i++)
	    memcpy(&ctxt->indent[i * ctxt->indent_size], xmlTreeIndentString,
		   ctxt->indent_size);
        ctxt->indent[ctxt->indent_nr * ctxt->indent_size] = 0;
    }

    if (xmlSaveNoEmptyTags) {
	ctxt->options |= XML_SAVE_NO_EMPTY;
    }
}